

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

double duckdb::BinaryLambdaWrapper::
       Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                 (anon_class_8_1_6971b95b fun,string_t left,string_t right,ValidityMask *mask,
                 idx_t idx)

{
  ulong uVar1;
  long lVar2;
  InvalidInputException *this;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  long lVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  long lVar9;
  long lVar10;
  char cVar11;
  ushort uVar12;
  byte bVar23;
  char cVar24;
  byte bVar25;
  char cVar26;
  byte bVar27;
  char cVar28;
  byte bVar29;
  char cVar30;
  byte bVar31;
  undefined1 auVar21 [16];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  bitset<256UL> __result;
  bitset<256UL> array_set_1;
  string local_a8;
  undefined8 local_88;
  long local_80;
  undefined8 local_78;
  long local_70;
  pointer local_68;
  size_type asStack_60 [3];
  ulong local_48 [5];
  undefined4 uVar13;
  undefined6 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar34 [14];
  undefined1 auVar35 [14];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  
  local_78 = fun.result;
  local_70 = left.value._0_8_;
  local_88 = left.value._8_8_;
  local_80 = right.value._0_8_;
  if (((uint)fun.result != 0) && (uVar3 = left.value._8_4_, uVar3 != 0)) {
    local_a8.field_2._M_allocated_capacity = 0;
    local_a8.field_2._8_8_ = 0;
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 0;
    lVar2 = left.value._0_8_;
    if ((uint)fun.result < 0xd) {
      lVar2 = (long)&local_78 + 4;
    }
    uVar4 = 0;
    do {
      (&local_a8._M_dataplus)[*(byte *)(lVar2 + uVar4) >> 6]._M_p =
           (pointer)((ulong)(&local_a8._M_dataplus)[*(byte *)(lVar2 + uVar4) >> 6]._M_p |
                    1L << (*(byte *)(lVar2 + uVar4) & 0x3f));
      uVar4 = uVar4 + 1;
    } while (((ulong)fun.result & 0xffffffff) != uVar4);
    local_48[2] = 0;
    local_48[3] = 0;
    local_48[0] = 0;
    local_48[1] = 0;
    lVar2 = right.value._0_8_;
    if (uVar3 < 0xd) {
      lVar2 = (long)&local_88 + 4;
    }
    uVar4 = 0;
    do {
      local_48[*(byte *)(lVar2 + uVar4) >> 6] =
           local_48[*(byte *)(lVar2 + uVar4) >> 6] | 1L << (*(byte *)(lVar2 + uVar4) & 0x3f);
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
    asStack_60[1] = local_a8.field_2._M_allocated_capacity;
    asStack_60[2] = 0;
    local_68 = local_a8._M_dataplus._M_p;
    asStack_60[0] = local_a8._M_string_length;
    lVar2 = 0;
    do {
      uVar4 = local_48[lVar2 + 1];
      (&local_68)[lVar2] = (pointer)((ulong)(&local_68)[lVar2] & local_48[lVar2]);
      asStack_60[lVar2] = asStack_60[lVar2] & uVar4;
      lVar2 = lVar2 + 2;
    } while (lVar2 != 4);
    lVar2 = 0;
    lVar5 = 0;
    lVar7 = 0;
    do {
      auVar21 = *(undefined1 (*) [16])(&local_68 + lVar2);
      auVar36._0_2_ = auVar21._0_2_ >> 1;
      auVar36._2_2_ = auVar21._2_2_ >> 1;
      auVar36._4_2_ = auVar21._4_2_ >> 1;
      auVar36._6_2_ = auVar21._6_2_ >> 1;
      auVar36._8_2_ = auVar21._8_2_ >> 1;
      auVar36._10_2_ = auVar21._10_2_ >> 1;
      auVar36._12_2_ = auVar21._12_2_ >> 1;
      auVar36._14_2_ = auVar21._14_2_ >> 1;
      auVar36 = auVar36 & _DAT_01edf1b0;
      uVar12 = CONCAT11(auVar21[1] - auVar36[1],auVar21[0] - auVar36[0]);
      uVar13 = CONCAT13(auVar21[3] - auVar36[3],CONCAT12(auVar21[2] - auVar36[2],uVar12));
      uVar14 = CONCAT15(auVar21[5] - auVar36[5],CONCAT14(auVar21[4] - auVar36[4],uVar13));
      uVar15 = CONCAT17(auVar21[7] - auVar36[7],CONCAT16(auVar21[6] - auVar36[6],uVar14));
      auVar16._0_10_ = CONCAT19(auVar21[9] - auVar36[9],CONCAT18(auVar21[8] - auVar36[8],uVar15));
      auVar16[10] = auVar21[10] - auVar36[10];
      auVar16[0xb] = auVar21[0xb] - auVar36[0xb];
      auVar18[0xc] = auVar21[0xc] - auVar36[0xc];
      auVar18._0_12_ = auVar16;
      auVar18[0xd] = auVar21[0xd] - auVar36[0xd];
      auVar20[0xe] = auVar21[0xe] - auVar36[0xe];
      auVar20._0_14_ = auVar18;
      auVar20[0xf] = auVar21[0xf] - auVar36[0xf];
      auVar36 = auVar20 & _DAT_01edf1c0;
      auVar21._0_2_ = uVar12 >> 2;
      auVar21._2_2_ = (ushort)((uint)uVar13 >> 0x12);
      auVar21._4_2_ = (ushort)((uint6)uVar14 >> 0x22);
      auVar21._6_2_ = (ushort)((ulong)uVar15 >> 0x32);
      auVar21._8_2_ = (ushort)((unkuint10)auVar16._0_10_ >> 0x42);
      auVar21._10_2_ = auVar16._10_2_ >> 2;
      auVar21._12_2_ = auVar18._12_2_ >> 2;
      auVar21._14_2_ = auVar20._14_2_ >> 2;
      auVar21 = auVar21 & _DAT_01edf1c0;
      cVar11 = auVar21[0] + auVar36[0];
      bVar23 = auVar21[1] + auVar36[1];
      uVar12 = CONCAT11(bVar23,cVar11);
      cVar24 = auVar21[2] + auVar36[2];
      bVar25 = auVar21[3] + auVar36[3];
      uVar13 = CONCAT13(bVar25,CONCAT12(cVar24,uVar12));
      cVar26 = auVar21[4] + auVar36[4];
      bVar27 = auVar21[5] + auVar36[5];
      uVar14 = CONCAT15(bVar27,CONCAT14(cVar26,uVar13));
      cVar28 = auVar21[6] + auVar36[6];
      bVar29 = auVar21[7] + auVar36[7];
      uVar15 = CONCAT17(bVar29,CONCAT16(cVar28,uVar14));
      cVar30 = auVar21[8] + auVar36[8];
      bVar31 = auVar21[9] + auVar36[9];
      auVar17._0_10_ = CONCAT19(bVar31,CONCAT18(cVar30,uVar15));
      auVar17[10] = auVar21[10] + auVar36[10];
      auVar17[0xb] = auVar21[0xb] + auVar36[0xb];
      auVar19[0xc] = auVar21[0xc] + auVar36[0xc];
      auVar19._0_12_ = auVar17;
      auVar19[0xd] = auVar21[0xd] + auVar36[0xd];
      auVar22[0xe] = auVar21[0xe] + auVar36[0xe];
      auVar22._0_14_ = auVar19;
      auVar22[0xf] = auVar21[0xf] + auVar36[0xf];
      auVar37[0] = (char)(uVar12 >> 4) + cVar11;
      auVar37[1] = (bVar23 >> 4) + bVar23;
      auVar37[2] = (char)(ushort)((uint)uVar13 >> 0x14) + cVar24;
      auVar37[3] = (bVar25 >> 4) + bVar25;
      auVar37[4] = (char)(ushort)((uint6)uVar14 >> 0x24) + cVar26;
      auVar37[5] = (bVar27 >> 4) + bVar27;
      auVar37[6] = (char)(ushort)((ulong)uVar15 >> 0x34) + cVar28;
      auVar37[7] = (bVar29 >> 4) + bVar29;
      auVar37[8] = (char)(ushort)((unkuint10)auVar17._0_10_ >> 0x44) + cVar30;
      auVar37[9] = (bVar31 >> 4) + bVar31;
      auVar37[10] = (char)(auVar17._10_2_ >> 4) + auVar17[10];
      auVar37[0xb] = (auVar17[0xb] >> 4) + auVar17[0xb];
      auVar37[0xc] = (char)(auVar19._12_2_ >> 4) + auVar19[0xc];
      auVar37[0xd] = (auVar19[0xd] >> 4) + auVar19[0xd];
      auVar37[0xe] = (char)(auVar22._14_2_ >> 4) + auVar22[0xe];
      auVar37[0xf] = (auVar22[0xf] >> 4) + auVar22[0xf];
      auVar21 = psadbw(auVar37 & _DAT_01edf1d0,(undefined1  [16])0x0);
      lVar5 = lVar5 + auVar21._0_8_;
      lVar7 = lVar7 + auVar21._8_8_;
      lVar2 = lVar2 + 2;
    } while (lVar2 != 4);
    lVar2 = 0;
    do {
      uVar4 = local_48[lVar2 + 1];
      uVar1 = (&local_a8._M_string_length)[lVar2];
      (&local_a8._M_dataplus)[lVar2]._M_p =
           (pointer)((ulong)(&local_a8._M_dataplus)[lVar2]._M_p | local_48[lVar2]);
      (&local_a8._M_string_length)[lVar2] = uVar1 | uVar4;
      lVar2 = lVar2 + 2;
    } while (lVar2 != 4);
    lVar2 = 0;
    lVar9 = 0;
    lVar10 = 0;
    do {
      auVar21 = *(undefined1 (*) [16])(&local_a8._M_dataplus + lVar2);
      auVar41._0_2_ = auVar21._0_2_ >> 1;
      auVar41._2_2_ = auVar21._2_2_ >> 1;
      auVar41._4_2_ = auVar21._4_2_ >> 1;
      auVar41._6_2_ = auVar21._6_2_ >> 1;
      auVar41._8_2_ = auVar21._8_2_ >> 1;
      auVar41._10_2_ = auVar21._10_2_ >> 1;
      auVar41._12_2_ = auVar21._12_2_ >> 1;
      auVar41._14_2_ = auVar21._14_2_ >> 1;
      auVar41 = auVar41 & _DAT_01edf1b0;
      uVar12 = CONCAT11(auVar21[1] - auVar41[1],auVar21[0] - auVar41[0]);
      uVar13 = CONCAT13(auVar21[3] - auVar41[3],CONCAT12(auVar21[2] - auVar41[2],uVar12));
      uVar14 = CONCAT15(auVar21[5] - auVar41[5],CONCAT14(auVar21[4] - auVar41[4],uVar13));
      uVar15 = CONCAT17(auVar21[7] - auVar41[7],CONCAT16(auVar21[6] - auVar41[6],uVar14));
      auVar32._0_10_ = CONCAT19(auVar21[9] - auVar41[9],CONCAT18(auVar21[8] - auVar41[8],uVar15));
      auVar32[10] = auVar21[10] - auVar41[10];
      auVar32[0xb] = auVar21[0xb] - auVar41[0xb];
      auVar34[0xc] = auVar21[0xc] - auVar41[0xc];
      auVar34._0_12_ = auVar32;
      auVar34[0xd] = auVar21[0xd] - auVar41[0xd];
      auVar38[0xe] = auVar21[0xe] - auVar41[0xe];
      auVar38._0_14_ = auVar34;
      auVar38[0xf] = auVar21[0xf] - auVar41[0xf];
      auVar21 = auVar38 & _DAT_01edf1c0;
      auVar39._0_2_ = uVar12 >> 2;
      auVar39._2_2_ = (ushort)((uint)uVar13 >> 0x12);
      auVar39._4_2_ = (ushort)((uint6)uVar14 >> 0x22);
      auVar39._6_2_ = (ushort)((ulong)uVar15 >> 0x32);
      auVar39._8_2_ = (ushort)((unkuint10)auVar32._0_10_ >> 0x42);
      auVar39._10_2_ = auVar32._10_2_ >> 2;
      auVar39._12_2_ = auVar34._12_2_ >> 2;
      auVar39._14_2_ = auVar38._14_2_ >> 2;
      auVar39 = auVar39 & _DAT_01edf1c0;
      cVar11 = auVar39[0] + auVar21[0];
      bVar23 = auVar39[1] + auVar21[1];
      uVar12 = CONCAT11(bVar23,cVar11);
      cVar24 = auVar39[2] + auVar21[2];
      bVar25 = auVar39[3] + auVar21[3];
      uVar13 = CONCAT13(bVar25,CONCAT12(cVar24,uVar12));
      cVar26 = auVar39[4] + auVar21[4];
      bVar27 = auVar39[5] + auVar21[5];
      uVar14 = CONCAT15(bVar27,CONCAT14(cVar26,uVar13));
      cVar28 = auVar39[6] + auVar21[6];
      bVar29 = auVar39[7] + auVar21[7];
      uVar15 = CONCAT17(bVar29,CONCAT16(cVar28,uVar14));
      cVar30 = auVar39[8] + auVar21[8];
      bVar31 = auVar39[9] + auVar21[9];
      auVar33._0_10_ = CONCAT19(bVar31,CONCAT18(cVar30,uVar15));
      auVar33[10] = auVar39[10] + auVar21[10];
      auVar33[0xb] = auVar39[0xb] + auVar21[0xb];
      auVar35[0xc] = auVar39[0xc] + auVar21[0xc];
      auVar35._0_12_ = auVar33;
      auVar35[0xd] = auVar39[0xd] + auVar21[0xd];
      auVar40[0xe] = auVar39[0xe] + auVar21[0xe];
      auVar40._0_14_ = auVar35;
      auVar40[0xf] = auVar39[0xf] + auVar21[0xf];
      auVar42[0] = (char)(uVar12 >> 4) + cVar11;
      auVar42[1] = (bVar23 >> 4) + bVar23;
      auVar42[2] = (char)(ushort)((uint)uVar13 >> 0x14) + cVar24;
      auVar42[3] = (bVar25 >> 4) + bVar25;
      auVar42[4] = (char)(ushort)((uint6)uVar14 >> 0x24) + cVar26;
      auVar42[5] = (bVar27 >> 4) + bVar27;
      auVar42[6] = (char)(ushort)((ulong)uVar15 >> 0x34) + cVar28;
      auVar42[7] = (bVar29 >> 4) + bVar29;
      auVar42[8] = (char)(ushort)((unkuint10)auVar33._0_10_ >> 0x44) + cVar30;
      auVar42[9] = (bVar31 >> 4) + bVar31;
      auVar42[10] = (char)(auVar33._10_2_ >> 4) + auVar33[10];
      auVar42[0xb] = (auVar33[0xb] >> 4) + auVar33[0xb];
      auVar42[0xc] = (char)(auVar35._12_2_ >> 4) + auVar35[0xc];
      auVar42[0xd] = (auVar35[0xd] >> 4) + auVar35[0xd];
      auVar42[0xe] = (char)(auVar40._14_2_ >> 4) + auVar40[0xe];
      auVar42[0xf] = (auVar40[0xf] >> 4) + auVar40[0xf];
      auVar21 = psadbw(auVar42 & _DAT_01edf1d0,(undefined1  [16])0x0);
      lVar9 = lVar9 + auVar21._0_8_;
      lVar10 = lVar10 + auVar21._8_8_;
      lVar2 = lVar2 + 2;
    } while (lVar2 != 4);
    auVar8._0_8_ = lVar7 + lVar5;
    auVar6._0_8_ = lVar10 + lVar9;
    auVar8._8_4_ = (int)((ulong)auVar8._0_8_ >> 0x20);
    auVar8._12_4_ = 0x45300000;
    auVar6._8_4_ = (int)((ulong)auVar6._0_8_ >> 0x20);
    auVar6._12_4_ = 0x45300000;
    return ((auVar8._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)auVar8._0_8_) - 4503599627370496.0)) /
           ((auVar6._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)auVar6._0_8_) - 4503599627370496.0));
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"Jaccard Function: An argument too short!","");
  InvalidInputException::InvalidInputException(this,&local_a8);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}